

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O2

void crnlib::LzmaEnc_FastPosInit(Byte *g_FastPos)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  
  g_FastPos[0] = '\0';
  g_FastPos[1] = '\x01';
  lVar1 = 2;
  for (uVar2 = 2; (int)uVar2 != 0x1a; uVar2 = (ulong)((int)uVar2 + 1)) {
    lVar1 = (long)(int)lVar1;
    for (uVar3 = 0; uVar3 >> ((char)(uVar2 >> 1) - 1U & 0x1f) == 0; uVar3 = uVar3 + 1) {
      g_FastPos[lVar1] = (Byte)uVar2;
      lVar1 = lVar1 + 1;
    }
  }
  return;
}

Assistant:

void LzmaEnc_FastPosInit(Byte* g_FastPos) {
  int c = 2, slotFast;
  g_FastPos[0] = 0;
  g_FastPos[1] = 1;

  for (slotFast = 2; slotFast < kNumLogBits * 2; slotFast++) {
    UInt32 k = (1 << ((slotFast >> 1) - 1));
    UInt32 j;
    for (j = 0; j < k; j++, c++)
      g_FastPos[c] = (Byte)slotFast;
  }
}